

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool CheckSequenceLocksAtTip(CBlockIndex *tip,LockPoints *lock_points)

{
  bool bVar1;
  long in_FS_OFFSET;
  pair<int,_long> lockPair;
  CBlockIndex index;
  CBlockIndex CStack_b8;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (tip == (CBlockIndex *)0x0) {
    __assert_fail("tip != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0xf4,"bool CheckSequenceLocksAtTip(CBlockIndex *, const LockPoints &)");
  }
  CBlockIndex::CBlockIndex(&CStack_b8);
  CStack_b8.nHeight = tip->nHeight + 1;
  lockPair._4_4_ = 0;
  lockPair.first = lock_points->height;
  lockPair.second = lock_points->time;
  CStack_b8.pprev = tip;
  bVar1 = EvaluateSequenceLocks(&CStack_b8,lockPair);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CheckSequenceLocksAtTip(CBlockIndex* tip,
                             const LockPoints& lock_points)
{
    assert(tip != nullptr);

    CBlockIndex index;
    index.pprev = tip;
    // CheckSequenceLocksAtTip() uses active_chainstate.m_chain.Height()+1 to evaluate
    // height based locks because when SequenceLocks() is called within
    // ConnectBlock(), the height of the block *being*
    // evaluated is what is used.
    // Thus if we want to know if a transaction can be part of the
    // *next* block, we need to use one more than active_chainstate.m_chain.Height()
    index.nHeight = tip->nHeight + 1;

    return EvaluateSequenceLocks(index, {lock_points.height, lock_points.time});
}